

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VMOV_64_sp(DisasContext_conflict1 *s,arg_VMOV_64_sp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 pTVar2;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_VMOV_64_sp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpsp_v2(s->isar);
  if (_Var1) {
    _Var1 = vfp_access_check(s);
    if (_Var1) {
      if (a->op == 0) {
        pTVar2 = load_reg(s,a->rt);
        neon_store_reg32(tcg_ctx_00,pTVar2,a->vm);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        pTVar2 = load_reg(s,a->rt2);
        neon_store_reg32(tcg_ctx_00,pTVar2,a->vm + 1);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      }
      else {
        pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
        neon_load_reg32(tcg_ctx_00,pTVar2,a->vm);
        store_reg(s,a->rt,pTVar2);
        pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
        neon_load_reg32(tcg_ctx_00,pTVar2,a->vm + 1);
        store_reg(s,a->rt2,pTVar2);
      }
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VMOV_64_sp(DisasContext *s, arg_VMOV_64_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    /*
     * VMOV between two general-purpose registers and two single precision
     * floating point registers
     */
    if (!vfp_access_check(s)) {
        return true;
    }

    if (a->op) {
        /* fpreg to gpreg */
        tmp = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, tmp, a->vm);
        store_reg(s, a->rt, tmp);
        tmp = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, tmp, a->vm + 1);
        store_reg(s, a->rt2, tmp);
    } else {
        /* gpreg to fpreg */
        tmp = load_reg(s, a->rt);
        neon_store_reg32(tcg_ctx, tmp, a->vm);
        tcg_temp_free_i32(tcg_ctx, tmp);
        tmp = load_reg(s, a->rt2);
        neon_store_reg32(tcg_ctx, tmp, a->vm + 1);
        tcg_temp_free_i32(tcg_ctx, tmp);
    }

    return true;
}